

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.h
# Opt level: O1

Indices * __thiscall jhu::thrax::Span::indices(Indices *__return_storage_ptr__,Span *this)

{
  short *psVar1;
  uint uVar2;
  short *psVar3;
  short sVar4;
  size_type __n;
  allocator_type local_11;
  
  uVar2 = (int)this->end - (int)this->start;
  __n = 0;
  if (0 < (int)uVar2) {
    __n = (size_type)uVar2;
  }
  std::vector<short,_std::allocator<short>_>::vector(__return_storage_ptr__,__n,&local_11);
  psVar3 = (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    sVar4 = this->start;
    do {
      *psVar3 = sVar4;
      sVar4 = sVar4 + 1;
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto indices() const {
    Indices result(size());
    std::iota(result.begin(), result.end(), start);
    return result;
  }